

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

string * __thiscall
libtorrent::print_entry_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,bdecode_node *e,bool single_line,
          int indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  undefined7 in_register_00000009;
  string_view sVar6;
  string_view str_00;
  string ret;
  string local_188;
  char str [100];
  char indent_str [200];
  
  memset(indent_str,0x20,200);
  indent_str[0] = ',';
  indent_str[1] = '\n';
  indent_str[199] = '\0';
  if ((uint)CONCAT71(in_register_00000009,single_line) < 0xc5) {
    indent_str[(CONCAT71(in_register_00000009,single_line) & 0xffffffff) + 2] = '\0';
  }
  paVar1 = &ret.field_2;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  ret._M_dataplus._M_p = (pointer)paVar1;
  if ((long)*(int *)(this + 0x2c) == -1) {
switchD_0018a7b2_caseD_0:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"none",(allocator<char> *)str);
    goto LAB_0018ab1b;
  }
  switch(*(uint *)(*(long *)(this + 0x18) + (long)*(int *)(this + 0x2c) * 8) >> 0x1d) {
  case 0:
    goto switchD_0018a7b2_caseD_0;
  case 1:
    std::__cxx11::string::push_back((char)&ret);
    iVar3 = anon_unknown_10::line_longer_than((bdecode_node *)this,200);
    bVar2 = iVar3 != -1 | (byte)e;
    if (bVar2 == 0) {
      std::__cxx11::string::append((char *)&ret);
    }
    for (iVar3 = 0; iVar4 = bdecode_node::dict_size((bdecode_node *)this), iVar3 < iVar4;
        iVar3 = iVar3 + 1) {
      if (iVar3 == 0 && bVar2 == 1) {
        std::__cxx11::string::push_back((char)&ret);
      }
      bdecode_node::dict_at
                ((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                  *)str,(bdecode_node *)this,iVar3);
      sVar6.len_ = 1;
      sVar6.ptr_ = (char *)str._8_8_;
      anon_unknown_10::print_string
                ((anon_unknown_10 *)&ret,(string *)str._0_8_,sVar6,SUB41(indent,0));
      std::__cxx11::string::append((char *)&ret);
      print_entry_abi_cxx11_
                (&local_188,(libtorrent *)(str + 0x10),(bdecode_node *)((ulong)e & 0xff),
                 (bool)(single_line + '\x02'),indent);
      std::__cxx11::string::append((string *)&ret);
      std::__cxx11::string::~string((string *)&local_188);
      bdecode_node::dict_size((bdecode_node *)this);
      std::__cxx11::string::append((char *)&ret);
      std::
      _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)(str + 0x10));
    }
    std::__cxx11::string::push_back((char)&ret);
    goto LAB_0018aac7;
  case 2:
    std::__cxx11::string::push_back((char)&ret);
    iVar3 = anon_unknown_10::line_longer_than((bdecode_node *)this,200);
    bVar2 = iVar3 != -1 | (byte)e;
    if (bVar2 == 0) {
      std::__cxx11::string::append((char *)&ret);
    }
    for (iVar3 = 0; iVar4 = bdecode_node::list_size((bdecode_node *)this), iVar3 < iVar4;
        iVar3 = iVar3 + 1) {
      if (iVar3 == 0 && bVar2 == 1) {
        std::__cxx11::string::push_back((char)&ret);
      }
      bdecode_node::list_at((bdecode_node *)str,(bdecode_node *)this,iVar3);
      print_entry_abi_cxx11_
                (&local_188,(libtorrent *)str,(bdecode_node *)(ulong)((uint)e & 0xff),
                 (bool)(single_line + '\x02'),indent);
      std::__cxx11::string::append((string *)&ret);
      std::__cxx11::string::~string((string *)&local_188);
      std::
      _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)str);
      bdecode_node::list_size((bdecode_node *)this);
      std::__cxx11::string::append((char *)&ret);
    }
    std::__cxx11::string::push_back((char)&ret);
LAB_0018aac7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p == &ret.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ret.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = ret._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = ret._M_string_length;
    break;
  case 3:
    sVar6 = bdecode_node::string_value((bdecode_node *)this);
    str_00.ptr_ = (char *)sVar6.len_;
    str_00.len_ = (ulong)e & 0xff;
    anon_unknown_10::print_string
              ((anon_unknown_10 *)&ret,(string *)sVar6.ptr_,str_00,SUB41(indent,0));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ret.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = ret._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = ret._M_string_length;
    break;
  case 4:
    iVar5 = bdecode_node::int_value((bdecode_node *)this);
    snprintf(str,100,"%ld",iVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,str,(allocator<char> *)&local_188);
    goto LAB_0018ab1b;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         (ulong)(uint7)ret.field_2._M_allocated_capacity._1_7_ << 8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ret.field_2._8_8_;
    __return_storage_ptr__->_M_string_length = 0;
  }
  ret._M_dataplus._M_p = (pointer)&ret.field_2;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
LAB_0018ab1b:
  std::__cxx11::string::~string((string *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string print_entry(bdecode_node const& e
		, bool single_line, int indent)
	{
		char indent_str[200];
		using std::memset;
		memset(indent_str, ' ', 200);
		indent_str[0] = ',';
		indent_str[1] = '\n';
		indent_str[199] = 0;
		if (indent < 197 && indent >= 0) indent_str[indent + 2] = 0;
		std::string ret;
		switch (e.type())
		{
			case bdecode_node::none_t: return "none";
			case bdecode_node::int_t:
			{
				char str[100];
				std::snprintf(str, sizeof(str), "%" PRId64, e.int_value());
				return str;
			}
			case bdecode_node::string_t:
			{
				print_string(ret, e.string_value(), single_line);
				return ret;
			}
			case bdecode_node::list_t:
			{
				ret += '[';
				bool one_liner = line_longer_than(e, 200) != -1 || single_line;

				if (!one_liner) ret += indent_str + 1;
				for (int i = 0; i < e.list_size(); ++i)
				{
					if (i == 0 && one_liner) ret += ' ';
					ret += print_entry(e.list_at(i), single_line, indent + 2);
					if (i < e.list_size() - 1) ret += (one_liner ? ", " : indent_str);
					else ret += (one_liner ? " " : indent_str + 1);
				}
				ret += ']';
				return ret;
			}
			case bdecode_node::dict_t:
			{
				ret += '{';
				bool one_liner = line_longer_than(e, 200) != -1 || single_line;

				if (!one_liner) ret += indent_str + 1;
				for (int i = 0; i < e.dict_size(); ++i)
				{
					if (i == 0 && one_liner) ret += ' ';
					std::pair<string_view, bdecode_node> ent = e.dict_at(i);
					print_string(ret, ent.first, true);
					ret += ": ";
					ret += print_entry(ent.second, single_line, indent + 2);
					if (i < e.dict_size() - 1) ret += (one_liner ? ", " : indent_str);
					else ret += (one_liner ? " " : indent_str + 1);
				}
				ret += '}';
				return ret;
			}
		}
		return ret;
	}